

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall
Centaurus::ATNPrinter<char>::print(ATNPrinter<char> *this,wostream *os,Identifier *key)

{
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_60;
  Identifier *local_20;
  Identifier *key_local;
  wostream *os_local;
  ATNPrinter<char> *this_local;
  
  local_20 = key;
  key_local = (Identifier *)os;
  os_local = (wostream *)this;
  print_atn_abi_cxx11_(&local_60,this,os,0,key);
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~pair(&local_60);
  return;
}

Assistant:

void print(std::wostream& os, const Identifier& key)
	{
		print_atn(os, 0, key);
	}